

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.cpp
# Opt level: O0

string * __thiscall YAML::Tag::Translate_abi_cxx11_(Tag *this,Directives *directives)

{
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined4 *in_RSI;
  Directives *in_RDI;
  char *in_stack_fffffffffffffe80;
  allocator *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Directives *pDVar2;
  allocator local_119;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  undefined1 local_b1 [33];
  string local_90 [55];
  allocator local_59;
  string local_58 [32];
  string local_38 [56];
  
  switch(*in_RSI) {
  case 0:
    std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 10));
    break;
  case 1:
    pDVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"!",&local_59);
    Directives::TranslateTagHandle(pDVar2,(string *)in_RDI);
    std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    in_RDI = pDVar2;
    break;
  case 2:
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
    pDVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_b1 + 1),"!!",(allocator *)__lhs);
    Directives::TranslateTagHandle(pDVar2,(string *)in_RDI);
    std::operator+(__lhs,in_RDX);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    in_RDI = pDVar2;
    break;
  case 3:
    pDVar2 = in_RDI;
    std::operator+((char *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::operator+(in_RDX,in_stack_fffffffffffffe80);
    Directives::TranslateTagHandle(pDVar2,(string *)in_RDI);
    std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    in_RDI = pDVar2;
    break;
  case 4:
    paVar1 = &local_119;
    pDVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"!",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    in_RDI = pDVar2;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"yaml-cpp: internal error, bad tag type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (string *)in_RDI;
}

Assistant:

const std::string Tag::Translate(const Directives& directives) {
  switch (type) {
    case VERBATIM:
      return value;
    case PRIMARY_HANDLE:
      return directives.TranslateTagHandle("!") + value;
    case SECONDARY_HANDLE:
      return directives.TranslateTagHandle("!!") + value;
    case NAMED_HANDLE:
      return directives.TranslateTagHandle("!" + handle + "!") + value;
    case NON_SPECIFIC:
      // TODO:
      return "!";
    default:
      assert(false);
  }
  throw std::runtime_error("yaml-cpp: internal error, bad tag type");
}